

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_>::Resize
          (TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_> *this,hash_t nhsize)

{
  Node *block;
  IPair *pIVar1;
  Node *pNVar2;
  ulong uVar3;
  FUDMFKeys *other;
  
  uVar3 = (ulong)this->Size;
  block = this->Nodes;
  SetNodeVector(this,nhsize);
  this->NumUsed = 0;
  if (uVar3 != 0) {
    pIVar1 = &block->Pair;
    do {
      other = &pIVar1->Value;
      if (*(long *)((long)(other + -1) + 8) != 1) {
        pNVar2 = NewKey(this,*(int *)((long)(other + -1) + 0x10));
        TArray<FUDMFKey,_FUDMFKey>::DoCopy
                  (&(pNVar2->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>,
                   &other->super_TArray<FUDMFKey,_FUDMFKey>);
        (pNVar2->Pair).Value.mSorted = other->mSorted;
        TArray<FUDMFKey,_FUDMFKey>::~TArray(&other->super_TArray<FUDMFKey,_FUDMFKey>);
      }
      pIVar1 = (IPair *)((long)(other + 1) + 8);
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  M_Free(block);
  return;
}

Assistant:

void Resize(hash_t nhsize)
	{
		hash_t i, oldhsize = Size;
		Node *nold = Nodes;
		/* create new hash part with appropriate size */
		SetNodeVector(nhsize);
		/* re-insert elements from hash part */
		NumUsed = 0;
		for (i = 0; i < oldhsize; ++i)
		{
			if (!nold[i].IsNil())
			{
				Node *n = NewKey(nold[i].Pair.Key);
				::new(&n->Pair.Value) VT(nold[i].Pair.Value);
				nold[i].~Node();
			}
		}
		M_Free(nold);
	}